

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

void __thiscall wasm::ReReloop::triage(ReReloop *this,Expression *curr)

{
  bool bVar1;
  Block *pBVar2;
  Fatal local_1d8;
  Unreachable *local_50;
  Unreachable *un;
  Return *ret;
  Switch *sw;
  Break *br;
  If *iff;
  Loop *loop;
  Block *block;
  Expression *curr_local;
  ReReloop *this_local;
  
  block = (Block *)curr;
  curr_local = (Expression *)this;
  loop = (Loop *)Expression::dynCast<wasm::Block>(curr);
  if ((Block *)loop == (Block *)0x0) {
    iff = (If *)Expression::dynCast<wasm::Loop>((Expression *)block);
    if (iff == (If *)0x0) {
      br = (Break *)Expression::dynCast<wasm::If>((Expression *)block);
      if (br == (Break *)0x0) {
        sw = (Switch *)Expression::dynCast<wasm::Break>((Expression *)block);
        if (sw == (Switch *)0x0) {
          ret = (Return *)Expression::dynCast<wasm::Switch>((Expression *)block);
          if ((Switch *)ret == (Switch *)0x0) {
            un = (Unreachable *)Expression::dynCast<wasm::Return>((Expression *)block);
            if ((Return *)un == (Return *)0x0) {
              local_50 = Expression::dynCast<wasm::Unreachable>((Expression *)block);
              if (local_50 == (Unreachable *)0x0) {
                bVar1 = Expression::is<wasm::Try>((Expression *)block);
                if (((bVar1) || (bVar1 = Expression::is<wasm::Throw>((Expression *)block), bVar1))
                   || (bVar1 = Expression::is<wasm::Rethrow>((Expression *)block), bVar1)) {
                  Fatal::Fatal(&local_1d8);
                  Fatal::operator<<(&local_1d8,
                                    (char (*) [46])"ReReloop does not support EH instructions yet");
                  Fatal::~Fatal(&local_1d8);
                }
                pBVar2 = getCurrBlock(this);
                ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                          (&(pBVar2->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(Expression *)block);
              }
              else {
                UnreachableTask::handle(this,local_50);
              }
            }
            else {
              ReturnTask::handle(this,(Return *)un);
            }
          }
          else {
            SwitchTask::handle(this,(Switch *)ret);
          }
        }
        else {
          BreakTask::handle(this,(Break *)sw);
        }
      }
      else {
        IfTask::handle(this,(If *)br);
      }
    }
    else {
      LoopTask::handle(this,(Loop *)iff);
    }
  }
  else {
    BlockTask::handle(this,(Block *)loop);
  }
  return;
}

Assistant:

void triage(Expression* curr) {
    if (auto* block = curr->dynCast<Block>()) {
      BlockTask::handle(*this, block);
    } else if (auto* loop = curr->dynCast<Loop>()) {
      LoopTask::handle(*this, loop);
    } else if (auto* iff = curr->dynCast<If>()) {
      IfTask::handle(*this, iff);
    } else if (auto* br = curr->dynCast<Break>()) {
      BreakTask::handle(*this, br);
    } else if (auto* sw = curr->dynCast<Switch>()) {
      SwitchTask::handle(*this, sw);
    } else if (auto* ret = curr->dynCast<Return>()) {
      ReturnTask::handle(*this, ret);
    } else if (auto* un = curr->dynCast<Unreachable>()) {
      UnreachableTask::handle(*this, un);
    } else if (curr->is<Try>() || curr->is<Throw>() || curr->is<Rethrow>()) {
      Fatal() << "ReReloop does not support EH instructions yet";
    } else {
      // not control flow, so just a simple element
      getCurrBlock()->list.push_back(curr);
    }
  }